

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string_view __thiscall google::protobuf::Symbol::full_name(Symbol *this)

{
  SymbolBase *pSVar1;
  string_view sVar2;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  pSVar1 = this->ptr_;
  switch(pSVar1->symbol_type_) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\a':
  case '\b':
    sVar2._M_str = *(char **)(*(long *)(pSVar1 + 8) + 0x20);
    sVar2._M_len = *(size_t *)(*(long *)(pSVar1 + 8) + 0x28);
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x2d9,5,"false");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_18);
  case '\t':
    sVar2._M_str = (char *)**(undefined8 **)(pSVar1 + 0x10);
    sVar2._M_len = (*(undefined8 **)(pSVar1 + 0x10))[1];
    break;
  case '\n':
    local_18._M_str = (char *)**(undefined8 **)(*(long *)(pSVar1 + 8) + 0x10);
    local_18._M_len = (*(undefined8 **)(*(long *)(pSVar1 + 8) + 0x10))[1];
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_18,0,(long)*(int *)(pSVar1 + 4));
  }
  return sVar2;
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }